

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

bool __thiscall Gluco::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  lbool *plVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  if (this->incremental == 0) {
    if ((int)(*(ulong *)&c->header >> 0x20) < 1) {
      return false;
    }
    lVar3 = 0;
    do {
      iVar1 = *(int *)(&c[1].header.field_0x0 + lVar3 * 4);
      bVar4 = (this->assigns).data[iVar1 >> 1].value == ((byte)iVar1 & 1);
      if (bVar4) {
        return bVar4;
      }
      bVar5 = (*(ulong *)&c->header >> 0x20) - 1 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar5);
  }
  else {
    plVar2 = (this->assigns).data;
    bVar4 = true;
    if (plVar2[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1)) {
      iVar1 = *(int *)&c[1].header.field_0x4;
      bVar4 = plVar2[iVar1 >> 1].value == ((byte)iVar1 & 1);
    }
  }
  return bVar4;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
  if(incremental)  // Check clauses with many selectors is too time consuming
    return (value(c[0]) == l_True) || (value(c[1]) == l_True);

  // Default mode.
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; 
}